

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001be760 = 0x2d2d2d2d2d2d2d;
    uRam00000000001be767 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001be750 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001be758 = 0x2d2d2d2d2d2d2d;
    DAT_001be75f = 0x2d;
    _DAT_001be740 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001be748 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001be730 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001be738 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001be728 = 0x2d2d2d2d2d2d2d2d;
    DAT_001be76f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }